

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O0

void hputcom(char *hstring,char *keyword,char *comment)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_RDX;
  char *in_RSI;
  char *q2;
  char *q1;
  char *c1;
  char *c0;
  char *v2;
  char *v1;
  char *vp;
  int lcom;
  int lkeyword;
  char line [100];
  char squot;
  char *local_c8;
  char *local_b0;
  char *local_a8;
  char *local_98;
  int local_90;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  
  local_b0 = (char *)0x0;
  sVar2 = strlen(in_RSI);
  if (((int)sVar2 == 7) &&
     ((iVar1 = strncmp(in_RSI,"COMMENT",7), iVar1 == 0 ||
      (iVar1 = strncmp(in_RSI,"HISTORY",7), iVar1 == 0)))) {
    pcVar3 = ksearch(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_a8 = pcVar3 + 0x50;
    strncpy(local_a8,pcVar3,0x50);
    for (local_98 = pcVar3; local_98 < local_a8; local_98 = local_98 + 1) {
      *local_98 = ' ';
    }
    strncpy(pcVar3,in_RSI,7);
  }
  else {
    local_b0 = ksearch(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    local_a8 = local_b0 + 0x50;
    if (local_b0 == (char *)0x0) {
      return;
    }
    strncpy(&stack0xffffffffffffff78,local_b0,0x50);
    pcVar3 = strchr(&stack0xffffffffffffff78,0x27);
    if (pcVar3 == (char *)0x0) {
      local_c8 = (char *)0x0;
    }
    else {
      local_c8 = strchr(pcVar3 + 1,0x27);
    }
    if ((local_c8 == (char *)0x0) || ((long)local_c8 - (long)&stack0xffffffffffffff78 < 0x1f)) {
      local_b0 = local_b0 + 0x1f;
    }
    else {
      local_b0 = local_b0 + (long)(local_c8 + (2 - (long)&stack0xffffffffffffff78));
    }
    strncpy(local_b0,"/ ",2);
  }
  sVar2 = strlen(in_RDX);
  local_90 = (int)sVar2;
  if (0 < local_90) {
    local_b0 = local_b0 + 2;
    if (local_a8 < local_b0 + local_90) {
      local_90 = (int)local_a8 - (int)local_b0;
    }
    strncpy(local_b0,in_RDX,(long)local_90);
  }
  return;
}

Assistant:

static void
hputcom (hstring,keyword,comment)

  char *hstring;
  char *keyword;
  char *comment;
{
	char squot;
	char line[100];
	int lkeyword, lcom;
	char *vp, *v1, *v2, *c0 = NULL, *c1, *q1, *q2;

	squot = 39;

/*  Find length of variable name */
	lkeyword = strlen (keyword);

/*  If COMMENT or HISTORY, always add it just before the END */
	if (lkeyword == 7 && (strncmp (keyword,"COMMENT",7) == 0 ||
	    strncmp (keyword,"HISTORY",7) == 0)) {

	/* Find end of header */
	    v1 = ksearch (hstring,"END");
	    v2 = v1 + 80;
	    strncpy (v2, v1, 80);

	/*  blank out new line and insert keyword */
	    for (vp = v1; vp < v2; vp++)
		*vp = ' ';
	    strncpy (v1, keyword, lkeyword);
	    }

/* search header string for variable name */
	else {
	    v1 = ksearch (hstring,keyword);
	    v2 = v1 + 80;

	/* if parameter is not found, return without doing anything */
	    if (v1 == NULL) {
		return;
		}

	/* otherwise, extract entry for this variable from the header */
	    strncpy (line, v1, 80);

	/* check for quoted value */
	    q1 = strchr (line,squot);
	    if (q1 != NULL)
		q2 = strchr (q1+1,squot);
	    else
		q2 = NULL;

	    if (q2 == NULL || q2-line < 31)
		c0 = v1 + 31;
	    else
		c0 = v1 + (q2-line) + 2; /* allan: 1997-09-30, was c0=q2+2 */

	    strncpy (c0, "/ ",2);
	    }

/* create new entry */
	lcom = strlen (comment);

	if (lcom > 0) {
	    c1 = c0 + 2;
	    if (c1+lcom > v2)
		lcom = v2 - c1;
	    strncpy (c1, comment, lcom);
	    }

}